

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_solver.cpp
# Opt level: O0

void __thiscall WorldSolver::take_path(WorldSolver *this,WorldPath *path)

{
  bool bVar1;
  reference this_00;
  string *__rhs;
  vector<Item_*,_std::allocator<Item_*>_> *this_01;
  reference ppIVar2;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> local_d0;
  pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_> local_b8;
  Item *local_98;
  Item *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Item_*,_std::allocator<Item_*>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Json *local_28;
  Json *debug_log;
  WorldNode *destination;
  WorldPath *path_local;
  WorldSolver *this_local;
  
  destination = (WorldNode *)path;
  path_local = (WorldPath *)this;
  debug_log = (Json *)WorldPath::destination(path);
  bVar1 = vectools::contains<WorldNode*>(&this->_explored_nodes,(WorldNode **)&debug_log);
  if (!bVar1) {
    bVar1 = vectools::contains<WorldNode*>(&this->_nodes_to_explore,(WorldNode **)&debug_log);
    if (!bVar1) {
      std::vector<WorldNode*,std::allocator<WorldNode*>>::emplace_back<WorldNode*&>
                ((vector<WorldNode*,std::allocator<WorldNode*>> *)&this->_nodes_to_explore,
                 (WorldNode **)&debug_log);
      local_28 = debug_log_for_current_step_abi_cxx11_(this);
      this_00 = nlohmann::
                basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_28,"exploration");
      __rhs = WorldNode::id_abi_cxx11_((WorldNode *)debug_log);
      std::operator+(&local_68,"Added ",__rhs);
      std::operator+(&local_48,&local_68," to accessible nodes");
      nlohmann::
      basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::emplace_back<std::__cxx11::string>
                ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)this_00,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  this_01 = WorldPath::items_placed_when_crossing((WorldPath *)destination);
  __end1 = std::vector<Item_*,_std::allocator<Item_*>_>::begin(this_01);
  item = (Item *)std::vector<Item_*,_std::allocator<Item_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                      (&__end1,(__normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                *)&item);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
              operator*(&__end1);
    local_98 = *ppIVar2;
    empty_reachable_item_sources(&local_d0,this);
    std::make_pair<Item*&,std::vector<ItemSource*,std::allocator<ItemSource*>>>
              (&local_b8,&local_98,&local_d0);
    std::
    vector<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>,std::allocator<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>>>
    ::emplace_back<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>>
              ((vector<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>,std::allocator<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>>>
                *)&this->_scheduled_item_placements,&local_b8);
    std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>::~pair(&local_b8);
    std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::~vector(&local_d0);
    __gnu_cxx::__normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void WorldSolver::take_path(WorldPath* path)
{
    WorldNode* destination = path->destination();
    if (!vectools::contains(_explored_nodes, destination) && !vectools::contains(_nodes_to_explore, destination))
    {
        _nodes_to_explore.emplace_back(destination);

        Json& debug_log = this->debug_log_for_current_step();
        debug_log["exploration"].emplace_back("Added " + destination->id() + " to accessible nodes");
    }

    for(Item* item : path->items_placed_when_crossing())
    {
        _scheduled_item_placements.emplace_back(std::make_pair(
                item, this->empty_reachable_item_sources()
        ));
    }
}